

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utMetadata.cpp
# Opt level: O0

void __thiscall
utMetadata_get_set_string_Test_Test::TestBody(utMetadata_get_set_string_Test_Test *this)

{
  aiString *this_00;
  undefined4 index_00;
  bool bVar1;
  uint index_01;
  aiMetadata *paVar2;
  char *pcVar3;
  char *in_R9;
  string local_1238;
  AssertHelper local_1218;
  Message local_1210;
  bool local_1201;
  undefined1 local_1200 [8];
  AssertionResult gtest_ar__3;
  string local_11e8;
  string local_11c8;
  AssertHelper local_11a8;
  Message local_11a0;
  undefined1 local_1198 [8];
  AssertionResult gtest_ar__2;
  Message local_1180;
  allocator local_1171;
  string local_1170;
  aiString local_114c;
  undefined1 local_d48 [8];
  AssertionResult gtest_ar;
  aiString result;
  AssertHelper local_910;
  Message local_908;
  bool local_8f9;
  undefined1 local_8f8 [8];
  AssertionResult gtest_ar__1;
  string local_8e0;
  aiString local_8bc;
  string local_4b8;
  AssertHelper local_498;
  Message local_490;
  undefined1 local_488 [8];
  AssertionResult gtest_ar_;
  string local_470;
  aiString local_450;
  allocator local_39;
  undefined1 local_38 [8];
  string key;
  bool success;
  uint index;
  utMetadata_get_set_string_Test_Test *this_local;
  
  paVar2 = aiMetadata::Alloc(1);
  (this->super_utMetadata).m_data = paVar2;
  key.field_2._12_4_ = 0;
  key.field_2._M_local_buf[0xb] = '\0';
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,"test",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  index_00 = key.field_2._12_4_;
  paVar2 = (this->super_utMetadata).m_data;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_470,"test",(allocator *)((long)&gtest_ar_.message_.ptr_ + 7));
  aiString::aiString(&local_450,&local_470);
  key.field_2._M_local_buf[0xb] =
       aiMetadata::Set<aiString>(paVar2,index_00,(string *)local_38,&local_450);
  std::__cxx11::string::~string((string *)&local_470);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_488,(bool *)(key.field_2._M_local_buf + 0xb),(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
  if (!bVar1) {
    testing::Message::Message(&local_490);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_4b8,(internal *)local_488,(AssertionResult *)0xc4bd85,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_498,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMetadata.cpp"
               ,0x99,pcVar3);
    testing::internal::AssertHelper::operator=(&local_498,&local_490);
    testing::internal::AssertHelper::~AssertHelper(&local_498);
    std::__cxx11::string::~string((string *)&local_4b8);
    testing::Message::~Message(&local_490);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
  paVar2 = (this->super_utMetadata).m_data;
  index_01 = key.field_2._12_4_ + 10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_8e0,"test",(allocator *)((long)&gtest_ar__1.message_.ptr_ + 7));
  aiString::aiString(&local_8bc,&local_8e0);
  key.field_2._M_local_buf[0xb] =
       aiMetadata::Set<aiString>(paVar2,index_01,(string *)local_38,&local_8bc);
  std::__cxx11::string::~string((string *)&local_8e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar__1.message_.ptr_ + 7));
  local_8f9 = (bool)(~key.field_2._M_local_buf[0xb] & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8f8,&local_8f9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8f8);
  if (!bVar1) {
    testing::Message::Message(&local_908);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)(result.data + 0x3f8),(internal *)local_8f8,(AssertionResult *)0xc4bd85,
               "true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_910,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMetadata.cpp"
               ,0x9c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_910,&local_908);
    testing::internal::AssertHelper::~AssertHelper(&local_910);
    std::__cxx11::string::~string((string *)(result.data + 0x3f8));
    testing::Message::~Message(&local_908);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8f8);
  this_00 = (aiString *)((long)&gtest_ar.message_.ptr_ + 4);
  aiString::aiString(this_00);
  key.field_2._M_local_buf[0xb] =
       aiMetadata::Get<aiString>((this->super_utMetadata).m_data,(string *)local_38,this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1170,"test",&local_1171);
  aiString::aiString(&local_114c,&local_1170);
  testing::internal::EqHelper<false>::Compare<aiString,aiString>
            ((EqHelper<false> *)local_d48,"aiString( std::string( \"test\" ) )","result",&local_114c
             ,(aiString *)((long)&gtest_ar.message_.ptr_ + 4));
  std::__cxx11::string::~string((string *)&local_1170);
  std::allocator<char>::~allocator((allocator<char> *)&local_1171);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d48);
  if (!bVar1) {
    testing::Message::Message(&local_1180);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMetadata.cpp"
               ,0xa0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_1180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_1180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d48);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1198,(bool *)(key.field_2._M_local_buf + 0xb),(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1198);
  if (!bVar1) {
    testing::Message::Message(&local_11a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_11c8,(internal *)local_1198,(AssertionResult *)0xc4bd85,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_11a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMetadata.cpp"
               ,0xa1,pcVar3);
    testing::internal::AssertHelper::operator=(&local_11a8,&local_11a0);
    testing::internal::AssertHelper::~AssertHelper(&local_11a8);
    std::__cxx11::string::~string((string *)&local_11c8);
    testing::Message::~Message(&local_11a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1198);
  paVar2 = (this->super_utMetadata).m_data;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_11e8,"bla",(allocator *)((long)&gtest_ar__3.message_.ptr_ + 7));
  key.field_2._M_local_buf[0xb] =
       aiMetadata::Get<aiString>(paVar2,&local_11e8,(aiString *)((long)&gtest_ar.message_.ptr_ + 4))
  ;
  std::__cxx11::string::~string((string *)&local_11e8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar__3.message_.ptr_ + 7));
  local_1201 = (bool)(~key.field_2._M_local_buf[0xb] & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1200,&local_1201,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1200);
  if (!bVar1) {
    testing::Message::Message(&local_1210);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1238,(internal *)local_1200,(AssertionResult *)0xc4bd85,"true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMetadata.cpp"
               ,0xa4,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1218,&local_1210);
    testing::internal::AssertHelper::~AssertHelper(&local_1218);
    std::__cxx11::string::~string((string *)&local_1238);
    testing::Message::~Message(&local_1210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1200);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

TEST_F( utMetadata, get_set_string_Test ) {
    m_data = aiMetadata::Alloc( 1 );

    unsigned int index( 0 );
    bool success( false );
    const std::string key = "test";
    success = m_data->Set( index, key, aiString( std::string( "test" ) ) );
    EXPECT_TRUE( success );

    success = m_data->Set( index+10, key, aiString( std::string( "test" ) ) );
    EXPECT_FALSE( success );

    aiString result;
    success = m_data->Get( key, result );
    EXPECT_EQ( aiString( std::string( "test" ) ), result );
    EXPECT_TRUE( success );

    success = m_data->Get( "bla", result );
    EXPECT_FALSE( success );
}